

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrittenFontTrueType.cpp
# Opt level: O0

bool __thiscall
WrittenFontTrueType::AddANSICandidates
          (WrittenFontTrueType *this,GlyphUnicodeMappingList *inGlyphsList,UShortList *ioCandidates)

{
  bool bVar1;
  pointer pGVar2;
  size_type sVar3;
  const_reference pvVar4;
  byte local_5f;
  ushort local_5e [10];
  BoolAndByte local_4a;
  _Self local_48;
  _Self local_40;
  const_iterator it;
  int local_30;
  bool local_2b;
  bool local_2a;
  WinAnsiEncoding winAnsiEncoding;
  BoolAndByte encodingResult;
  UShortList *ioCandidates_local;
  GlyphUnicodeMappingList *inGlyphsList_local;
  WrittenFontTrueType *this_local;
  
  if ((this->fontSupportsWinAnsiEncoding & 1U) == 0) {
    this_local._7_1_ = false;
  }
  else {
    local_2b = true;
    local_30 = 0;
    std::pair<bool,_unsigned_char>::pair<bool,_int,_true>
              ((pair<bool,_unsigned_char> *)&stack0xffffffffffffffd6,&local_2b,&local_30);
    WinAnsiEncoding::WinAnsiEncoding((WinAnsiEncoding *)((long)&it._M_node + 7));
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>::begin
                   (inGlyphsList);
    while( true ) {
      local_48._M_node =
           (_List_node_base *)
           std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>::end
                     (inGlyphsList);
      bVar1 = std::operator!=(&local_40,&local_48);
      local_5f = 0;
      if (bVar1) {
        local_5f = local_2a;
      }
      if ((local_5f & 1) == 0) break;
      pGVar2 = std::_List_const_iterator<GlyphUnicodeMapping>::operator->(&local_40);
      sVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                        (&pGVar2->mUnicodeValues);
      if (sVar3 == 1) {
        pGVar2 = std::_List_const_iterator<GlyphUnicodeMapping>::operator->(&local_40);
        pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::front
                           (&pGVar2->mUnicodeValues);
        if (*pvVar4 == 0x2022) {
          local_2a = false;
        }
        else {
          pGVar2 = std::_List_const_iterator<GlyphUnicodeMapping>::operator->(&local_40);
          pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::front
                             (&pGVar2->mUnicodeValues);
          local_4a = WinAnsiEncoding::Encode((WinAnsiEncoding *)((long)&it._M_node + 7),*pvVar4);
          std::pair<bool,_unsigned_char>::operator=
                    ((pair<bool,_unsigned_char> *)&stack0xffffffffffffffd6,&local_4a);
          if ((local_2a & 1U) != 0) {
            local_5e[0] = (ushort)(byte)winAnsiEncoding;
            std::__cxx11::list<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                      (ioCandidates,local_5e);
          }
        }
      }
      else {
        local_2a = false;
      }
      std::_List_const_iterator<GlyphUnicodeMapping>::operator++(&local_40);
    }
    this_local._7_1_ = (bool)(local_2a & 1);
    WinAnsiEncoding::~WinAnsiEncoding((WinAnsiEncoding *)((long)&it._M_node + 7));
  }
  return this_local._7_1_;
}

Assistant:

bool WrittenFontTrueType::AddANSICandidates(const GlyphUnicodeMappingList& inGlyphsList, UShortList& ioCandidates) {
	if(!fontSupportsWinAnsiEncoding) {
		return false;
	}

	// i'm totally relying on the text here, which is fine till i'll do ligatures, in which case
	// i'll need to make something different out of the text.
	// as you can see this has little to do with glyphs (mainly cause i can't use FreeType to map the glyphs
	// back to the rleevant unicode values...but no need anyways...that's why i carry the text).
	BoolAndByte encodingResult(true,0);
	WinAnsiEncoding winAnsiEncoding;
	GlyphUnicodeMappingList::const_iterator it = inGlyphsList.begin(); 

	for(; it != inGlyphsList.end() && encodingResult.first; ++it)
	{
		// don't bother with characters of more (or less) than one unicode
		if(it->mUnicodeValues.size() != 1)
		{
			encodingResult.first = false;
		}
		else if(0x2022 == it->mUnicodeValues.front())
		{
			// From the reference:
			// In WinAnsiEncoding, all unused codes greater than 40 map to the bullet character. 
			// However, only code 225 is specifically assigned to the bullet character; other codes are subject to future reassignment.

			// now i don't know if it's related or not...but acrobat isn't happy when i'm using winansi with bullet. and text coming after that bullet may be
			// corrupted.
			// so i'm forcing CID if i hit bullet till i know better.
			encodingResult.first = false;
		}
		else
		{
			encodingResult = winAnsiEncoding.Encode(it->mUnicodeValues.front());
			if(encodingResult.first)
				ioCandidates.push_back(encodingResult.second);
		}
	}

	return encodingResult.first;
}